

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DebugWriter.cpp
# Opt level: O0

void __thiscall UnifiedRegex::DebugWriter::PrintEscapedChar(DebugWriter *this,Char c)

{
  Char c_local;
  DebugWriter *this_local;
  
  CheckForNewline(this);
  if ((ushort)c < 0x100) {
    if (c == L'-') {
      Output::Print(L"\\x2d");
    }
    else if (((ushort)c < 0x20) || (0x7e < (ushort)c)) {
      Output::Print(L"\\x%lc%lc",(ulong)(ushort)L"0123456789abcdef"[(int)(uint)(ushort)c >> 4],
                    (ulong)(ushort)L"0123456789abcdef"[(int)((ushort)c & 0xf)]);
    }
    else {
      Output::Print(L"%lc",(ulong)(ushort)c);
    }
  }
  else {
    Output::Print(L"\\u%lc%lc%lc%lc",(ulong)(ushort)L"0123456789abcdef"[(int)(uint)(ushort)c >> 0xc]
                  ,(ulong)(ushort)L"0123456789abcdef"[(int)((int)(uint)(ushort)c >> 8 & 0xf)],
                  (ulong)(ushort)L"0123456789abcdef"[(int)((int)(uint)(ushort)c >> 4 & 0xf)],
                  (ulong)(ushort)L"0123456789abcdef"[(int)((ushort)c & 0xf)]);
  }
  return;
}

Assistant:

void DebugWriter::PrintEscapedChar(const Char c)
    {
        CheckForNewline();
        if (c > 0xff)
            Output::Print(_u("\\u%lc%lc%lc%lc"), hex[c >> 12], hex[(c >> 8) & 0xf], hex[(c >> 4) & 0xf], hex[c & 0xf]);
        else if (c == '-')
            Output::Print(_u("\\x2d"));
        else if (c < ' ' || c > '~')
            Output::Print(_u("\\x%lc%lc"), hex[c >> 4], hex[c & 0xf]);
        else
            Output::Print(_u("%lc"), c);
    }